

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostic.cpp
# Opt level: O0

void __thiscall
spvtools::DiagnosticStream::DiagnosticStream(DiagnosticStream *this,DiagnosticStream *other)

{
  string local_38 [32];
  DiagnosticStream *local_18;
  DiagnosticStream *other_local;
  DiagnosticStream *this_local;
  
  local_18 = other;
  other_local = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  (this->position_).line = (local_18->position_).line;
  (this->position_).column = (local_18->position_).column;
  (this->position_).index = (local_18->position_).index;
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  function(&this->consumer_,&local_18->consumer_);
  std::__cxx11::string::string
            ((string *)&this->disassembled_instruction_,
             (string *)&local_18->disassembled_instruction_);
  this->error_ = local_18->error_;
  local_18->error_ = SPV_FAILED_MATCH;
  std::__cxx11::ostringstream::str();
  std::operator<<((ostream *)this,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

DiagnosticStream::DiagnosticStream(DiagnosticStream&& other)
    : stream_(),
      position_(other.position_),
      consumer_(other.consumer_),
      disassembled_instruction_(std::move(other.disassembled_instruction_)),
      error_(other.error_) {
  // Prevent the other object from emitting output during destruction.
  other.error_ = SPV_FAILED_MATCH;
  // Some platforms are missing support for std::ostringstream functionality,
  // including:  move constructor, swap method.  Either would have been a
  // better choice than copying the string.
  stream_ << other.stream_.str();
}